

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O0

void __thiscall HVectorBase<double>::tight(HVectorBase<double> *this)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  long in_RDI;
  vector<double,_std::allocator<double>_> *pvVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double *value;
  HighsInt my_index_1;
  HighsInt i;
  size_t my_index;
  HighsInt totalCount;
  int local_1c;
  ulong local_18;
  int local_c;
  
  local_c = 0;
  if (*(int *)(in_RDI + 4) < 0) {
    for (local_18 = 0;
        sVar2 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20)),
        local_18 < sVar2; local_18 = local_18 + 1) {
      pvVar5 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x20);
      std::vector<double,_std::allocator<double>_>::operator[](pvVar5,local_18);
      std::abs((int)pvVar5);
      if (extraout_XMM0_Qa < 1e-14) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),local_18);
        *pvVar3 = 0.0;
      }
    }
  }
  else {
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 4); local_1c = local_1c + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_1c);
      iVar1 = *pvVar4;
      pvVar5 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x20);
      std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)iVar1);
      std::abs((int)pvVar5);
      if (extraout_XMM0_Qa_00 < 1e-14) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),(long)iVar1);
        *pvVar3 = 0.0;
      }
      else {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_c);
        *pvVar4 = iVar1;
        local_c = local_c + 1;
      }
    }
    *(int *)(in_RDI + 4) = local_c;
  }
  return;
}

Assistant:

void HVectorBase<Real>::tight() {
  /*
   * Zero values in Vector.array that do not exceed kHighsTiny in
   * magnitude, maintaining index if it is well defined
   */
  HighsInt totalCount = 0;
  using std::abs;
  if (count < 0) {
    for (size_t my_index = 0; my_index < array.size(); my_index++)
      if (abs(array[my_index]) < kHighsTiny) array[my_index] = 0;
  } else {
    for (HighsInt i = 0; i < count; i++) {
      const HighsInt my_index = index[i];
      const Real& value = array[my_index];
      if (abs(value) >= kHighsTiny) {
        index[totalCount++] = my_index;
      } else {
        array[my_index] = Real{0};
      }
    }
    count = totalCount;
  }
}